

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_errcode(sqlite3 *db)

{
  u8 uVar1;
  uint uVar2;
  
  uVar2 = 7;
  if (db != (sqlite3 *)0x0) {
    uVar1 = db->eOpenState;
    if (((uVar1 == 'm') || (uVar1 == 'v')) || (uVar1 == 0xba)) {
      if (db->mallocFailed == '\0') {
        uVar2 = db->errMask & db->errCode;
      }
    }
    else {
      uVar2 = 0x15;
      sqlite3_log(0x15,"API call with %s database connection pointer","invalid");
      sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x2abe3,
                  "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
    }
  }
  return uVar2;
}

Assistant:

SQLITE_API int sqlite3_errcode(sqlite3 *db){
  if( db && !sqlite3SafetyCheckSickOrOk(db) ){
    return SQLITE_MISUSE_BKPT;
  }
  if( !db || db->mallocFailed ){
    return SQLITE_NOMEM_BKPT;
  }
  return db->errCode & db->errMask;
}